

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::fboc::details::AttachmentParams::getName_abi_cxx11_
          (string *__return_storage_ptr__,AttachmentParams *this,AttachmentParams *params)

{
  GLenum bufType;
  GLenum bufType_00;
  GLenum bufType_01;
  string local_148;
  string local_128;
  string local_108;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  AttachmentParams *local_18;
  AttachmentParams *params_local;
  
  local_18 = this;
  params_local = (AttachmentParams *)__return_storage_ptr__;
  attTypeName_abi_cxx11_(&local_d8,(details *)(ulong)this->color0Kind,(GLenum)params);
  std::operator+(&local_b8,&local_d8,"_");
  attTypeName_abi_cxx11_(&local_108,(details *)(ulong)local_18->colornKind,bufType);
  std::operator+(&local_98,&local_b8,&local_108);
  std::operator+(&local_78,&local_98,"_");
  attTypeName_abi_cxx11_(&local_128,(details *)(ulong)local_18->depthKind,bufType_00);
  std::operator+(&local_58,&local_78,&local_128);
  std::operator+(&local_38,&local_58,"_");
  attTypeName_abi_cxx11_(&local_148,(details *)(ulong)local_18->stencilKind,bufType_01);
  std::operator+(__return_storage_ptr__,&local_38,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

string AttachmentParams::getName (const AttachmentParams& params)
{
	return (attTypeName(params.color0Kind) + "_" +
			attTypeName(params.colornKind) + "_" +
			attTypeName(params.depthKind) + "_" +
			attTypeName(params.stencilKind));
}